

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

rnndecaddrinfo *
trymatch(rnndeccontext *ctx,rnndelem **elems,int elemsnum,uint64_t addr,int write,int dwidth,
        uint64_t *indices,int indicesnum)

{
  rnnetype rVar1;
  rnndelem **pprVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  void *pvVar6;
  envy_colors *peVar7;
  uint uVar8;
  size_t __n;
  int iVar9;
  rnndeccontext *prVar10;
  int iVar11;
  char *pcVar12;
  rnndecaddrinfo *prVar13;
  ulong uVar14;
  rnndelem *prVar15;
  char *pcVar16;
  undefined1 *puVar17;
  ulong *puVar18;
  undefined4 in_register_0000008c;
  uint64_t addr_00;
  ulong uVar19;
  ulong uVar20;
  uint64_t uVar21;
  ulong local_a8;
  size_t local_a0;
  long local_98;
  char *local_90;
  char *tmp;
  ulong local_80;
  undefined1 *local_78;
  void *local_70;
  ulong local_68;
  int local_5c;
  rnndelem **local_58;
  char *local_50;
  char *res;
  rnndeccontext *local_40;
  char *local_38;
  char *name;
  
  local_70 = (void *)CONCAT44(in_register_0000008c,dwidth);
  puVar18 = &local_a8;
  if (0 < elemsnum) {
    local_98 = (long)(int)indices;
    local_80 = (ulong)indices & 0xffffffff;
    local_a0 = local_80 * 8;
    local_a8 = (ulong)(uint)elemsnum;
    local_68 = 0;
    tmp = (char *)addr;
    local_5c = write;
    local_58 = elems;
    local_40 = ctx;
    do {
      prVar15 = local_58[local_68];
      *(undefined8 *)((long)puVar18 + -8) = 0x107bbb;
      iVar11 = rnndec_varmatch(ctx,&prVar15->varinfo);
      if (iVar11 != 0) {
        prVar15 = local_58[local_68];
        rVar1 = prVar15->type;
        ctx = local_40;
        if (rVar1 == RNN_ETYPE_REG) {
          uVar14 = (long)tmp - prVar15->offset;
          if ((char *)prVar15->offset <= tmp) {
            uVar19 = prVar15->stride;
            if (uVar19 == 0) {
              uVar20 = 0;
            }
            else {
              uVar20 = uVar14 / uVar19;
              uVar14 = uVar14 % uVar19;
            }
            iVar11 = prVar15->width;
            if ((uVar14 < (ulong)(long)(iVar11 / local_5c)) && (uVar20 <= prVar15->length - 1)) {
              local_78 = (undefined1 *)uVar20;
              *(undefined8 *)((long)puVar18 + -8) = 0x107fd8;
              prVar13 = (rnndecaddrinfo *)calloc(0x18,1);
              prVar13->typeinfo = &prVar15->typeinfo;
              prVar13->width = iVar11;
              pcVar16 = local_40->colors->reset;
              pcVar12 = local_40->colors->rname;
              pcVar3 = prVar15->name;
              res = (char *)&prVar13->name;
              *(undefined8 *)((long)puVar18 + -8) = 0x108015;
              asprintf(&prVar13->name,"%s%s%s",pcVar12,pcVar3,pcVar16);
              uVar19 = local_80;
              if (0 < (int)indices) {
                uVar20 = 0;
                pcVar16 = *(char **)res;
                do {
                  uVar4 = *(undefined8 *)((long)local_70 + uVar20 * 8);
                  pcVar12 = local_40->colors->reset;
                  pcVar3 = local_40->colors->num;
                  *(undefined8 *)((long)puVar18 + -8) = 0x108055;
                  asprintf(&local_50,"%s[%s%#lx%s]",pcVar16,pcVar3,uVar4,pcVar12);
                  *(undefined8 *)((long)puVar18 + -8) = 0x10805d;
                  free(pcVar16);
                  *(char **)res = local_50;
                  uVar20 = uVar20 + 1;
                  pcVar16 = local_50;
                } while (uVar19 != uVar20);
              }
              pcVar16 = res;
              puVar17 = local_78;
              if (local_58[local_68]->length != 1) {
                pvVar6 = *(void **)res;
                pcVar12 = local_40->colors->reset;
                pcVar3 = local_40->colors->num;
                *(undefined8 *)((long)puVar18 + -8) = 0x1080b9;
                asprintf(&local_50,"%s[%s%#lx%s]",pvVar6,pcVar3,puVar17,pcVar12);
                *(undefined8 *)((long)puVar18 + -8) = 0x1080c1;
                free(pvVar6);
                *(char **)pcVar16 = local_50;
              }
              if (uVar14 == 0) {
                return prVar13;
              }
              uVar4 = *(undefined8 *)pcVar16;
              pcVar12 = local_40->colors->reset;
              pcVar3 = local_40->colors->err;
              *(undefined8 *)((long)puVar18 + -8) = 0x1080fd;
              asprintf(&local_90,"%s+%s%#lx%s",uVar4,pcVar3,uVar14,pcVar12);
              pvVar6 = *(void **)pcVar16;
              *(undefined8 *)((long)puVar18 + -8) = 0x108105;
              free(pvVar6);
              *(char **)pcVar16 = local_90;
              return prVar13;
            }
          }
        }
        else if (rVar1 == RNN_ETYPE_ARRAY) {
          uVar14 = (long)tmp - prVar15->offset;
          if ((char *)prVar15->offset <= tmp) {
            uVar19 = uVar14 / prVar15->stride;
            if (uVar19 <= prVar15->length - 1) {
              pcVar16 = local_40->colors->reset;
              pcVar12 = local_40->colors->rname;
              pcVar3 = prVar15->name;
              res = (char *)(uVar14 % prVar15->stride);
              *(undefined8 *)((long)puVar18 + -8) = 0x107eae;
              asprintf(&local_38,"%s%s%s",pcVar12,pcVar3,pcVar16);
              pvVar6 = local_70;
              uVar14 = local_80;
              if (0 < (int)indices) {
                uVar20 = 0;
                do {
                  pcVar12 = local_38;
                  uVar4 = *(undefined8 *)((long)pvVar6 + uVar20 * 8);
                  pcVar16 = local_40->colors->num;
                  *(undefined8 *)((long)puVar18 + -8) = 0x107eeb;
                  asprintf(&local_50,"%s[%s%#lx%s]",pcVar12,pcVar16,uVar4);
                  *(undefined8 *)((long)puVar18 + -8) = 0x107ef3;
                  free(pcVar12);
                  local_38 = local_50;
                  uVar20 = uVar20 + 1;
                } while (uVar14 != uVar20);
              }
              pcVar16 = local_38;
              pprVar2 = local_58;
              uVar14 = local_68;
              prVar15 = local_58[local_68];
              if (prVar15->length != 1) {
                pcVar12 = local_40->colors->num;
                *(undefined8 *)((long)puVar18 + -8) = 0x107f47;
                asprintf(&local_50,"%s[%s%#lx%s]",pcVar16,pcVar12,uVar19);
                *(undefined8 *)((long)puVar18 + -8) = 0x107f4f;
                free(pcVar16);
                local_38 = local_50;
                prVar15 = pprVar2[uVar14];
              }
              prVar10 = local_40;
              pcVar16 = res;
              iVar9 = local_5c;
              pprVar2 = prVar15->subelems;
              iVar11 = prVar15->subelemsnum;
              *(undefined8 *)((long)puVar18 + -0x10) = 0;
              *(undefined8 *)((long)puVar18 + -0x18) = 0x107f82;
              prVar13 = trymatch(prVar10,pprVar2,iVar11,(uint64_t)pcVar16,iVar9,0,
                                 *(uint64_t **)((long)puVar18 + -0x10),*(int *)((long)puVar18 + -8))
              ;
              pcVar12 = local_38;
              if (prVar13 == (rnndecaddrinfo *)0x0) {
                *(undefined8 *)((long)puVar18 + -8) = 0x10811f;
                prVar13 = (rnndecaddrinfo *)calloc(0x18,1);
                pcVar5 = local_38;
                peVar7 = prVar10->colors;
                pcVar12 = peVar7->reset;
                pcVar3 = peVar7->err;
                *(undefined8 *)((long)puVar18 + -8) = 0x10814c;
                asprintf(&local_90,"%s+%s%#lx%s",pcVar5,pcVar3,pcVar16,pcVar12);
                pcVar16 = local_38;
              }
              else {
                pcVar16 = prVar13->name;
                *(undefined8 *)((long)puVar18 + -8) = 0x107fb2;
                asprintf(&local_90,"%s.%s",pcVar12,pcVar16);
                pcVar16 = local_38;
                *(undefined8 *)((long)puVar18 + -8) = 0x107fbb;
                free(pcVar16);
                pcVar16 = prVar13->name;
              }
              *(undefined8 *)((long)puVar18 + -8) = 0x108155;
              free(pcVar16);
              prVar13->name = local_90;
              return prVar13;
            }
          }
        }
        else if (rVar1 == RNN_ETYPE_STRIPE) {
          uVar21 = prVar15->length;
          pcVar16 = (char *)0x0;
          puVar17 = (undefined1 *)puVar18;
          do {
            pvVar6 = local_70;
            __n = local_a0;
            pcVar12 = (char *)(prVar15->stride * (long)pcVar16 + prVar15->offset);
            addr_00 = (long)tmp - (long)pcVar12;
            ctx = local_40;
            puVar18 = (ulong *)puVar17;
            if (tmp < pcVar12) break;
            res = pcVar16;
            local_78 = puVar17;
            uVar8 = (uint)(uVar21 != 1) + (int)indices;
            if (prVar15->name != (char *)0x0) {
              uVar8 = 0;
            }
            puVar17 = puVar17 + -((ulong)uVar8 * 8 + 0xf & 0xfffffffffffffff0);
            prVar15 = local_58[local_68];
            if (prVar15->name == (char *)0x0) {
              if (0 < (int)indices) {
                *(undefined8 *)(puVar17 + -8) = 0x107c68;
                memcpy(puVar17,pvVar6,__n);
              }
              if (uVar21 != 1) {
                *(char **)(puVar17 + local_98 * 8) = res;
              }
            }
            prVar10 = local_40;
            iVar9 = local_5c;
            pprVar2 = prVar15->subelems;
            iVar11 = prVar15->subelemsnum;
            *(ulong *)(puVar17 + -0x10) = (ulong)uVar8;
            *(undefined8 *)(puVar17 + -0x18) = 0x107ca1;
            prVar13 = trymatch(prVar10,pprVar2,iVar11,addr_00,iVar9,(int)puVar17,
                               *(uint64_t **)(puVar17 + -0x10),*(int *)(puVar17 + -8));
            if (prVar13 != (rnndecaddrinfo *)0x0) {
              pcVar16 = local_58[local_68]->name;
              if (pcVar16 == (char *)0x0) {
                return prVar13;
              }
              pcVar12 = prVar10->colors->reset;
              pcVar3 = prVar10->colors->rname;
              *(undefined8 *)(puVar17 + -8) = 0x107d9b;
              asprintf(&local_38,"%s%s%s",pcVar3,pcVar16,pcVar12);
              uVar14 = local_80;
              if (0 < (int)indices) {
                uVar19 = 0;
                do {
                  uVar4 = *(undefined8 *)((long)local_70 + uVar19 * 8);
                  pcVar16 = prVar10->colors->reset;
                  pcVar12 = prVar10->colors->num;
                  *(undefined8 *)(puVar17 + -8) = 0x107dd3;
                  asprintf(&local_50,"%s[%s%#lx%s]",local_38,pcVar12,uVar4,pcVar16);
                  *(undefined8 *)(puVar17 + -8) = 0x107ddb;
                  free(local_38);
                  local_38 = local_50;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              pcVar12 = local_38;
              pcVar16 = res;
              if (local_58[local_68]->length != 1) {
                pcVar3 = prVar10->colors->reset;
                pcVar5 = prVar10->colors->num;
                *(undefined8 *)(puVar17 + -8) = 0x107e25;
                asprintf(&local_50,"%s[%s%#lx%s]",pcVar12,pcVar5,pcVar16,pcVar3);
                *(undefined8 *)(puVar17 + -8) = 0x107e2d;
                free(pcVar12);
                local_38 = local_50;
              }
              pcVar12 = local_38;
              pcVar16 = prVar13->name;
              *(undefined8 *)(puVar17 + -8) = 0x107e54;
              asprintf(&local_90,"%s.%s",pcVar12,pcVar16);
              pcVar16 = local_38;
              *(undefined8 *)(puVar17 + -8) = 0x107e5d;
              free(pcVar16);
              pcVar16 = prVar13->name;
              *(undefined8 *)(puVar17 + -8) = 0x107e67;
              free(pcVar16);
              prVar13->name = local_90;
              return prVar13;
            }
            pcVar16 = res + 1;
            prVar15 = local_58[local_68];
            uVar21 = prVar15->length;
            ctx = local_40;
            puVar17 = local_78;
            puVar18 = (ulong *)local_78;
          } while (pcVar16 <= (char *)(uVar21 - 1));
        }
      }
      local_68 = local_68 + 1;
    } while (local_68 != local_a8);
  }
  return (rnndecaddrinfo *)0x0;
}

Assistant:

static struct rnndecaddrinfo *trymatch (struct rnndeccontext *ctx, struct rnndelem **elems, int elemsnum, uint64_t addr, int write, int dwidth, uint64_t *indices, int indicesnum) {
	struct rnndecaddrinfo *res;
	int i, j;
	for (i = 0; i < elemsnum; i++) {
		if (!rnndec_varmatch(ctx, &elems[i]->varinfo))
			continue;
		uint64_t offset, idx;
		char *tmp, *name;
		switch (elems[i]->type) {
			case RNN_ETYPE_REG:
				if (addr < elems[i]->offset)
					break;
				if (elems[i]->stride) {
					idx = (addr-elems[i]->offset)/elems[i]->stride;
					offset = (addr-elems[i]->offset)%elems[i]->stride;
				} else {
					idx = 0;
					offset = addr-elems[i]->offset;
				}
				if (offset >= elems[i]->width/dwidth)
					break;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				res = calloc (sizeof *res, 1);
				res->typeinfo = &elems[i]->typeinfo;
				res->width = elems[i]->width;
				asprintf (&res->name, "%s%s%s", ctx->colors->rname, elems[i]->name, ctx->colors->reset);
				for (j = 0; j < indicesnum; j++)
					res->name = appendidx(ctx, res->name, indices[j]);
				if (elems[i]->length != 1)
					res->name = appendidx(ctx, res->name, idx);
				if (offset) {
					asprintf (&tmp, "%s+%s%#"PRIx64"%s", res->name, ctx->colors->err, offset, ctx->colors->reset);
					free(res->name);
					res->name = tmp;
				}
				return res;
			case RNN_ETYPE_STRIPE:
				for (idx = 0; idx < elems[i]->length || !elems[i]->length; idx++) {
					if (addr < elems[i]->offset + elems[i]->stride * idx)
						break;
					offset = addr - (elems[i]->offset + elems[i]->stride * idx);
					int extraidx = (elems[i]->length != 1);
					int nindnum = (elems[i]->name ? 0 : indicesnum + extraidx);
					uint64_t nind[nindnum];
					if (!elems[i]->name) {
						for (j = 0; j < indicesnum; j++)
							nind[j] = indices[j];
						if (extraidx)
							nind[indicesnum] = idx;
					}
					res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, nind, nindnum);
					if (!res)
						continue;
					if (!elems[i]->name)
						return res;
					asprintf (&name, "%s%s%s", ctx->colors->rname, elems[i]->name, ctx->colors->reset);
					for (j = 0; j < indicesnum; j++)
						name = appendidx(ctx, name, indices[j]);
					if (elems[i]->length != 1)
						name = appendidx(ctx, name, idx);
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				break;
			case RNN_ETYPE_ARRAY:
				if (addr < elems[i]->offset)
					break;
				idx = (addr-elems[i]->offset)/elems[i]->stride;
				offset = (addr-elems[i]->offset)%elems[i]->stride;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				asprintf (&name, "%s%s%s", ctx->colors->rname, elems[i]->name, ctx->colors->reset);
				for (j = 0; j < indicesnum; j++)
					name = appendidx(ctx, name, indices[j]);
				if (elems[i]->length != 1)
					name = appendidx(ctx, name, idx);
				if ((res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, 0, 0))) {
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				res = calloc (sizeof *res, 1);
				asprintf (&tmp, "%s+%s%#"PRIx64"%s", name, ctx->colors->err, offset, ctx->colors->reset);
				free(name);
				res->name = tmp;
				return res;
			default:
				break;
		}
	}
	return 0;
}